

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

void tcd_malloc_decode_tile
               (opj_tcd_t *tcd,opj_image_t *image,opj_cp_t *cp,int tileno,
               opj_codestream_info_t *cstr_info)

{
  long lVar1;
  opj_tccp_t *poVar2;
  opj_tcd_tilecomp_t *poVar3;
  opj_tcd_precinct_t *poVar4;
  undefined8 *puVar5;
  int iVar6;
  opj_tcp_t *poVar7;
  opj_tccp_t *poVar8;
  opj_tcd_tilecomp_t *poVar9;
  opj_image_comp_t *poVar10;
  ulong uVar11;
  OPJ_UINT32 OVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  opj_tcd_resolution_t *poVar16;
  opj_tcd_precinct_t *poVar17;
  opj_tcd_cblk_enc_t *poVar18;
  opj_tgt_tree_t *poVar19;
  byte bVar20;
  byte bVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  OPJ_UINT32 OVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  opj_tcd_band_t *poVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  long lVar39;
  uint uVar40;
  opj_tcd_tile_t *poVar41;
  OPJ_UINT32 OVar42;
  ulong uVar43;
  OPJ_UINT32 OVar44;
  uint uVar45;
  int iVar48;
  double dVar46;
  undefined1 auVar47 [16];
  int iVar49;
  int iVar53;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int local_a0;
  
  tcd->cp = cp;
  poVar7 = cp->tcps;
  iVar6 = cp->tileno[tileno];
  poVar41 = tcd->tcd_image->tiles + iVar6;
  for (lVar22 = 0; lVar22 < poVar41->numcomps; lVar22 = lVar22 + 1) {
    poVar8 = poVar7[iVar6].tccps;
    poVar2 = poVar8 + lVar22;
    poVar9 = poVar41->comps;
    poVar10 = image->comps;
    OVar42 = poVar10[lVar22].dx;
    poVar9[lVar22].x0 = (int)(poVar41->x0 + (OVar42 - 1)) / (int)OVar42;
    OVar44 = poVar10[lVar22].dy;
    poVar9[lVar22].y0 = (int)(poVar41->y0 + (OVar44 - 1)) / (int)OVar44;
    poVar9[lVar22].x1 = (int)((OVar42 - 1) + poVar41->x1) / (int)OVar42;
    poVar9[lVar22].y1 = (int)((OVar44 - 1) + poVar41->y1) / (int)OVar44;
    poVar3 = poVar9 + lVar22;
    OVar42 = poVar8[lVar22].numresolutions;
    uVar43 = (ulong)(int)OVar42;
    poVar9[lVar22].numresolutions = OVar42;
    poVar16 = (opj_tcd_resolution_t *)malloc(uVar43 * 0x98);
    poVar9[lVar22].resolutions = poVar16;
    for (lVar30 = 0; iVar14 = (int)uVar43, lVar30 < iVar14; lVar30 = lVar30 + 1) {
      uVar37 = (uint)lVar30;
      uVar13 = ~uVar37 + iVar14;
      bVar20 = (byte)uVar13;
      poVar16 = poVar3->resolutions;
      uVar23 = ~(-1 << (bVar20 & 0x1f));
      uVar34 = (int)(poVar3->x0 + uVar23) >> (bVar20 & 0x1f);
      poVar16[lVar30].x0 = uVar34;
      uVar36 = (int)(poVar3->y0 + uVar23) >> (bVar20 & 0x1f);
      poVar16[lVar30].y0 = uVar36;
      uVar40 = (int)(poVar3->x1 + uVar23) >> (bVar20 & 0x1f);
      poVar16[lVar30].x1 = uVar40;
      uVar38 = (int)(poVar3->y1 + uVar23) >> (bVar20 & 0x1f);
      poVar16[lVar30].y1 = uVar38;
      iVar31 = (uint)(lVar30 != 0) * 2 + 1;
      poVar16[lVar30].numbands = iVar31;
      OVar42 = 0xf;
      OVar44 = OVar42;
      if ((poVar2->csty & 1) != 0) {
        OVar42 = poVar2->prcw[lVar30];
        OVar44 = poVar2->prch[lVar30];
      }
      bVar20 = (byte)OVar42;
      uVar24 = -1 << (bVar20 & 0x1f);
      bVar21 = (byte)OVar44;
      uVar28 = -1 << (bVar21 & 0x1f);
      uVar45 = uVar28 & uVar36;
      uVar25 = uVar24 & uVar34;
      iVar35 = (int)((((1 << (bVar20 & 0x1f)) + uVar40) - 1 & uVar24) - uVar25) >> (bVar20 & 0x1f);
      if (uVar34 == uVar40) {
        iVar35 = 0;
      }
      poVar16[lVar30].pw = iVar35;
      iVar35 = (int)(((uVar38 + (1 << (bVar21 & 0x1f))) - 1 & uVar28) - uVar45) >> (bVar21 & 0x1f);
      if (uVar36 == uVar38) {
        iVar35 = 0;
      }
      poVar16[lVar30].ph = iVar35;
      if (lVar30 != 0) {
        uVar25 = (int)(uVar25 + 1) >> 1;
        uVar45 = (int)(uVar45 + 1) >> 1;
        OVar42 = OVar42 - 1;
        OVar44 = OVar44 - 1;
      }
      OVar26 = poVar2->cblkw;
      if ((int)OVar42 <= (int)poVar2->cblkw) {
        OVar26 = OVar42;
      }
      OVar12 = poVar2->cblkh;
      if ((int)OVar44 <= (int)poVar2->cblkh) {
        OVar12 = OVar44;
      }
      iVar35 = 1 << ((byte)(iVar14 - uVar37) & 0x1f);
      local_a0 = uVar37 * 3 + -2;
      bVar20 = (byte)OVar26;
      bVar21 = (byte)OVar12;
      auVar50 = ZEXT416(iVar14 - uVar37);
      lVar39 = 0;
      while (lVar39 < iVar31) {
        lVar1 = lVar39 + 1;
        iVar14 = (int)lVar1;
        if (lVar30 == 0) {
          iVar14 = 0;
        }
        poVar16[lVar30].bands[lVar39].bandno = iVar14;
        if (lVar30 == 0) {
          iVar31 = (int)(poVar3->x0 + uVar23) >> ZEXT416(uVar13);
          iVar48 = (int)(poVar3->y0 + uVar23) >> ZEXT416(uVar13);
          iVar49 = (int)(poVar3->x1 + uVar23) >> ZEXT416(uVar13);
          iVar53 = (int)(poVar3->y1 + uVar23) >> ZEXT416(uVar13);
          lVar29 = 0;
        }
        else {
          auVar51._0_4_ = -(uint)((int)lVar39 == 0);
          auVar51._8_4_ = -(uint)((int)lVar1 == 2);
          auVar51._12_4_ = -(uint)((int)((ulong)lVar1 >> 0x20) == 0);
          auVar47._4_4_ = auVar51._12_4_;
          auVar47._0_4_ = -(uint)((int)((ulong)lVar39 >> 0x20) == 0);
          auVar47._8_4_ = auVar51._12_4_;
          auVar47._12_4_ = auVar51._8_4_;
          auVar51._4_4_ = auVar51._8_4_;
          auVar51 = auVar51 & auVar47;
          auVar52._0_4_ = auVar51._0_4_ >> 0x1f;
          auVar52._4_4_ = auVar51._4_4_ >> 0x1f;
          auVar52._8_4_ = auVar51._8_4_ >> 0x1f;
          auVar52._12_4_ = auVar51._12_4_ >> 0x1f;
          auVar52 = auVar52 | ~auVar51 & ZEXT516(CONCAT14(lVar1 == 3,(uint)(lVar1 == 3)));
          iVar49 = (auVar52._0_4_ << uVar13 ^ 0xffffffffU) + iVar35;
          iVar53 = (auVar52._4_4_ ^ 0xffffffff) + iVar35;
          iVar31 = poVar3->x0 + iVar49 >> auVar50;
          iVar48 = poVar3->y0 + iVar53 >> auVar50;
          iVar49 = poVar3->x1 + iVar49 >> auVar50;
          iVar53 = poVar3->y1 + iVar53 >> auVar50;
          lVar29 = (long)((int)lVar39 + local_a0);
        }
        poVar32 = poVar16[lVar30].bands + lVar39;
        poVar32->x0 = iVar31;
        poVar32->y0 = iVar48;
        poVar32->x1 = iVar49;
        poVar32->y1 = iVar53;
        if (poVar2->qmfbid == 0) {
          iVar14 = dwt_getgain_real(iVar14);
        }
        else {
          iVar14 = dwt_getgain(iVar14);
        }
        iVar31 = poVar2->stepsizes[lVar29].mant;
        iVar48 = poVar2->stepsizes[lVar29].expn;
        dVar46 = ldexp(1.0,(iVar14 + image->comps[lVar22].prec) - iVar48);
        poVar32->stepsize = (float)(dVar46 * 0.5 * ((double)iVar31 * 0.00048828125 + 1.0));
        poVar32->numbps = iVar48 + -1 + poVar2->numgbits;
        iVar14 = poVar16[lVar30].pw;
        iVar31 = poVar16[lVar30].ph;
        poVar17 = (opj_tcd_precinct_t *)malloc((long)(iVar31 * iVar14) * 0x30);
        poVar32->precincts = poVar17;
        uVar43 = 0;
        while( true ) {
          if ((long)(iVar31 * iVar14) <= (long)uVar43) break;
          uVar33 = (ulong)(uint)((int)uVar43 >> 0x1f) << 0x20 | uVar43 & 0xffffffff;
          iVar49 = (int)((long)uVar33 % (long)iVar14);
          iVar14 = (int)((long)uVar33 / (long)iVar14);
          iVar31 = (iVar49 << ((byte)OVar42 & 0x1f)) + uVar25;
          iVar48 = (iVar14 << ((byte)OVar44 & 0x1f)) + uVar45;
          iVar49 = (iVar49 + 1 << ((byte)OVar42 & 0x1f)) + uVar25;
          iVar14 = (iVar14 + 1 << ((byte)OVar44 & 0x1f)) + uVar45;
          poVar17 = poVar32->precincts;
          if (iVar31 <= poVar32->x0) {
            iVar31 = poVar32->x0;
          }
          poVar17[uVar43].x0 = iVar31;
          if (iVar48 <= poVar32->y0) {
            iVar48 = poVar32->y0;
          }
          poVar17[uVar43].y0 = iVar48;
          if (poVar32->x1 <= iVar49) {
            iVar49 = poVar32->x1;
          }
          poVar17[uVar43].x1 = iVar49;
          if (poVar32->y1 <= iVar14) {
            iVar14 = poVar32->y1;
          }
          iVar31 = iVar31 >> (bVar20 & 0x1f);
          iVar48 = iVar48 >> (bVar21 & 0x1f);
          poVar17[uVar43].y1 = iVar14;
          iVar49 = ((iVar49 + ~(-1 << (bVar20 & 0x1f)) >> (bVar20 & 0x1f)) - iVar31 <<
                   (bVar20 & 0x1f)) >> (bVar20 & 0x1f);
          poVar4 = poVar17 + uVar43;
          poVar17[uVar43].cw = iVar49;
          iVar14 = ((iVar14 + ~(-1 << (bVar21 & 0x1f)) >> (bVar21 & 0x1f)) - iVar48 <<
                   (bVar21 & 0x1f)) >> (bVar21 & 0x1f);
          poVar17[uVar43].ch = iVar14;
          poVar18 = (opj_tcd_cblk_enc_t *)malloc((long)(iVar14 * iVar49) * 0x38);
          poVar17[uVar43].cblks.enc = poVar18;
          poVar19 = tgt_create(iVar49,iVar14);
          poVar17[uVar43].incltree = poVar19;
          poVar19 = tgt_create(poVar17[uVar43].cw,poVar17[uVar43].ch);
          poVar17[uVar43].imsbtree = poVar19;
          iVar14 = poVar17[uVar43].cw;
          uVar37 = poVar17[uVar43].ch * iVar14;
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          lVar39 = 0;
          for (uVar33 = 0; uVar37 != uVar33; uVar33 = uVar33 + 1) {
            uVar11 = (ulong)(uint)((int)uVar33 >> 0x1f) << 0x20 | uVar33 & 0xffffffff;
            iVar15 = (int)((long)uVar11 / (long)iVar14);
            iVar27 = (int)((long)uVar11 % (long)iVar14);
            iVar49 = iVar27 + iVar31 << (bVar20 & 0x1f);
            iVar53 = iVar15 + iVar48 << (bVar21 & 0x1f);
            iVar27 = iVar27 + iVar31 + 1 << (bVar20 & 0x1f);
            iVar15 = iVar15 + iVar48 + 1 << (bVar21 & 0x1f);
            poVar18 = (poVar4->cblks).enc;
            puVar5 = (undefined8 *)((long)&poVar18->data + lVar39);
            *puVar5 = 0;
            puVar5[1] = 0;
            if (iVar49 <= poVar4->x0) {
              iVar49 = poVar4->x0;
            }
            *(int *)((long)&poVar18->passes + lVar39) = iVar49;
            if (iVar53 <= poVar4->y0) {
              iVar53 = poVar4->y0;
            }
            *(int *)((long)&poVar18->passes + lVar39 + 4) = iVar53;
            if (poVar4->x1 <= iVar27) {
              iVar27 = poVar4->x1;
            }
            *(int *)((long)&poVar18->x0 + lVar39) = iVar27;
            if (poVar4->y1 <= iVar15) {
              iVar15 = poVar4->y1;
            }
            *(int *)((long)&poVar18->y0 + lVar39) = iVar15;
            *(undefined4 *)((long)&poVar18->numpasses + lVar39) = 0;
            lVar39 = lVar39 + 0x38;
          }
          uVar43 = uVar43 + 1;
          iVar14 = poVar16[lVar30].pw;
          iVar31 = poVar16[lVar30].ph;
        }
        lVar39 = lVar1;
        iVar31 = poVar16[lVar30].numbands;
      }
      uVar43 = (ulong)(uint)poVar3->numresolutions;
    }
  }
  return;
}

Assistant:

void tcd_malloc_decode_tile(opj_tcd_t *tcd, opj_image_t * image, opj_cp_t * cp, int tileno, opj_codestream_info_t *cstr_info) {
	int compno, resno, bandno, precno, cblkno;
	opj_tcp_t *tcp;
	opj_tcd_tile_t *tile;

	OPJ_ARG_NOT_USED(cstr_info);

	tcd->cp = cp;
	
	tcp = &(cp->tcps[cp->tileno[tileno]]);
	tile = &(tcd->tcd_image->tiles[cp->tileno[tileno]]);
	
	tileno = cp->tileno[tileno];
	
	for (compno = 0; compno < tile->numcomps; compno++) {
		opj_tccp_t *tccp = &tcp->tccps[compno];
		opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
		
		/* border of each tile component (global) */
		tilec->x0 = int_ceildiv(tile->x0, image->comps[compno].dx);
		tilec->y0 = int_ceildiv(tile->y0, image->comps[compno].dy);
		tilec->x1 = int_ceildiv(tile->x1, image->comps[compno].dx);
		tilec->y1 = int_ceildiv(tile->y1, image->comps[compno].dy);

		tilec->numresolutions = tccp->numresolutions;
		tilec->resolutions = (opj_tcd_resolution_t *) opj_malloc(tilec->numresolutions * sizeof(opj_tcd_resolution_t));
		
		for (resno = 0; resno < tilec->numresolutions; resno++) {
			int pdx, pdy;
			int levelno = tilec->numresolutions - 1 - resno;
			int tlprcxstart, tlprcystart, brprcxend, brprcyend;
			int tlcbgxstart, tlcbgystart, brcbgxend, brcbgyend;
			int cbgwidthexpn, cbgheightexpn;
			int cblkwidthexpn, cblkheightexpn;
			
			opj_tcd_resolution_t *res = &tilec->resolutions[resno];
			
			/* border for each resolution level (global) */
			res->x0 = int_ceildivpow2(tilec->x0, levelno);
			res->y0 = int_ceildivpow2(tilec->y0, levelno);
			res->x1 = int_ceildivpow2(tilec->x1, levelno);
			res->y1 = int_ceildivpow2(tilec->y1, levelno);
			res->numbands = resno == 0 ? 1 : 3;
			
			/* p. 35, table A-23, ISO/IEC FDIS154444-1 : 2000 (18 august 2000) */
			if (tccp->csty & J2K_CCP_CSTY_PRT) {
				pdx = tccp->prcw[resno];
				pdy = tccp->prch[resno];
			} else {
				pdx = 15;
				pdy = 15;
			}			
			
			/* p. 64, B.6, ISO/IEC FDIS15444-1 : 2000 (18 august 2000)  */
			tlprcxstart = int_floordivpow2(res->x0, pdx) << pdx;
			tlprcystart = int_floordivpow2(res->y0, pdy) << pdy;
			brprcxend = int_ceildivpow2(res->x1, pdx) << pdx;
			brprcyend = int_ceildivpow2(res->y1, pdy) << pdy;
			
			res->pw = (res->x0 == res->x1) ? 0 : ((brprcxend - tlprcxstart) >> pdx);
			res->ph = (res->y0 == res->y1) ? 0 : ((brprcyend - tlprcystart) >> pdy);
			
			if (resno == 0) {
				tlcbgxstart = tlprcxstart;
				tlcbgystart = tlprcystart;
				brcbgxend = brprcxend;
				brcbgyend = brprcyend;
				cbgwidthexpn = pdx;
				cbgheightexpn = pdy;
			} else {
				tlcbgxstart = int_ceildivpow2(tlprcxstart, 1);
				tlcbgystart = int_ceildivpow2(tlprcystart, 1);
				brcbgxend = int_ceildivpow2(brprcxend, 1);
				brcbgyend = int_ceildivpow2(brprcyend, 1);
				cbgwidthexpn = pdx - 1;
				cbgheightexpn = pdy - 1;
			}
			
			cblkwidthexpn = int_min(tccp->cblkw, cbgwidthexpn);
			cblkheightexpn = int_min(tccp->cblkh, cbgheightexpn);
			
			for (bandno = 0; bandno < res->numbands; bandno++) {
				int x0b, y0b;
				int gain, numbps;
				opj_stepsize_t *ss = NULL;
				
				opj_tcd_band_t *band = &res->bands[bandno];
				band->bandno = resno == 0 ? 0 : bandno + 1;
				x0b = (band->bandno == 1) || (band->bandno == 3) ? 1 : 0;
				y0b = (band->bandno == 2) || (band->bandno == 3) ? 1 : 0;
				
				if (band->bandno == 0) {
					/* band border (global) */
					band->x0 = int_ceildivpow2(tilec->x0, levelno);
					band->y0 = int_ceildivpow2(tilec->y0, levelno);
					band->x1 = int_ceildivpow2(tilec->x1, levelno);
					band->y1 = int_ceildivpow2(tilec->y1, levelno);
				} else {
					/* band border (global) */
					band->x0 = int_ceildivpow2(tilec->x0 - (1 << levelno) * x0b, levelno + 1);
					band->y0 = int_ceildivpow2(tilec->y0 - (1 << levelno) * y0b, levelno + 1);
					band->x1 = int_ceildivpow2(tilec->x1 - (1 << levelno) * x0b, levelno + 1);
					band->y1 = int_ceildivpow2(tilec->y1 - (1 << levelno) * y0b, levelno + 1);
				}
				
				ss = &tccp->stepsizes[resno == 0 ? 0 : 3 * (resno - 1) + bandno + 1];
				gain = tccp->qmfbid == 0 ? dwt_getgain_real(band->bandno) : dwt_getgain(band->bandno);
				numbps = image->comps[compno].prec + gain;
				band->stepsize = (float)(((1.0 + ss->mant / 2048.0) * pow(2.0, numbps - ss->expn)) * 0.5);
				band->numbps = ss->expn + tccp->numgbits - 1;	/* WHY -1 ? */
				
				band->precincts = (opj_tcd_precinct_t *) opj_malloc(res->pw * res->ph * sizeof(opj_tcd_precinct_t));
				
				for (precno = 0; precno < res->pw * res->ph; precno++) {
					int tlcblkxstart, tlcblkystart, brcblkxend, brcblkyend;
					int cbgxstart = tlcbgxstart + (precno % res->pw) * (1 << cbgwidthexpn);
					int cbgystart = tlcbgystart + (precno / res->pw) * (1 << cbgheightexpn);
					int cbgxend = cbgxstart + (1 << cbgwidthexpn);
					int cbgyend = cbgystart + (1 << cbgheightexpn);
					
					opj_tcd_precinct_t *prc = &band->precincts[precno];
					/* precinct size (global) */
					prc->x0 = int_max(cbgxstart, band->x0);
					prc->y0 = int_max(cbgystart, band->y0);
					prc->x1 = int_min(cbgxend, band->x1);
					prc->y1 = int_min(cbgyend, band->y1);
					
					tlcblkxstart = int_floordivpow2(prc->x0, cblkwidthexpn) << cblkwidthexpn;
					tlcblkystart = int_floordivpow2(prc->y0, cblkheightexpn) << cblkheightexpn;
					brcblkxend = int_ceildivpow2(prc->x1, cblkwidthexpn) << cblkwidthexpn;
					brcblkyend = int_ceildivpow2(prc->y1, cblkheightexpn) << cblkheightexpn;
					prc->cw = (brcblkxend - tlcblkxstart) >> cblkwidthexpn;
					prc->ch = (brcblkyend - tlcblkystart) >> cblkheightexpn;

					prc->cblks.dec = (opj_tcd_cblk_dec_t*) opj_malloc(prc->cw * prc->ch * sizeof(opj_tcd_cblk_dec_t));

					prc->incltree = tgt_create(prc->cw, prc->ch);
					prc->imsbtree = tgt_create(prc->cw, prc->ch);
					
					for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
						int cblkxstart = tlcblkxstart + (cblkno % prc->cw) * (1 << cblkwidthexpn);
						int cblkystart = tlcblkystart + (cblkno / prc->cw) * (1 << cblkheightexpn);
						int cblkxend = cblkxstart + (1 << cblkwidthexpn);
						int cblkyend = cblkystart + (1 << cblkheightexpn);					

						opj_tcd_cblk_dec_t* cblk = &prc->cblks.dec[cblkno];
						cblk->data = NULL;
						cblk->segs = NULL;
						/* code-block size (global) */
						cblk->x0 = int_max(cblkxstart, prc->x0);
						cblk->y0 = int_max(cblkystart, prc->y0);
						cblk->x1 = int_min(cblkxend, prc->x1);
						cblk->y1 = int_min(cblkyend, prc->y1);
						cblk->numsegs = 0;
					}
				} /* precno */
			} /* bandno */
		} /* resno */
	} /* compno */
	/* tcd_dump(stdout, tcd, &tcd->tcd_image); */
}